

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

reference __thiscall
pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_long>::operator[]
          (sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_long> *this,size_type pos)

{
  if ((this->bitmap_ >> (pos & 0x3f) & 1) != 0) {
    return this->elements_ + POPCOUNT(this->bitmap_ & (1L << ((byte)pos & 0x3f)) - 1U);
  }
  assert_failed("(sa.bitmap_ & mask) != 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x26a);
}

Assistant:

reference operator[] (size_type pos) noexcept {
            return sparse_array::index_impl (*this, pos);
        }